

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.h
# Opt level: O3

void __thiscall
slang::ast::SubroutineSymbol::SubroutineSymbol
          (SubroutineSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          VariableLifetime defaultLifetime,SubroutineKind subroutineKind)

{
  (this->super_Symbol).kind = Subroutine;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  DeclaredType::DeclaredType
            (&this->declaredReturnType,&this->super_Symbol,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  this->defaultLifetime = defaultLifetime;
  this->subroutineKind = subroutineKind;
  this->visibility = Public;
  (this->flags).m_bits = 0;
  this->outOfBlockIndex = 0;
  *(undefined2 *)
   &(this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool>._M_engaged = 0;
  this->returnValVar = (VariableSymbol *)0x0;
  this->thisVar = (VariableSymbol *)0x0;
  (this->blocks)._M_ptr = (pointer)0x0;
  (this->blocks)._M_extent._M_extent_value = 0;
  this->stmt = (Statement *)0x0;
  (this->arguments)._M_ptr = (pointer)0x0;
  (this->arguments)._M_extent._M_extent_value = 0;
  this->overrides = (SubroutineSymbol *)0x0;
  this->prototype = (MethodPrototypeSymbol *)0x0;
  return;
}

Assistant:

SubroutineSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                     VariableLifetime defaultLifetime, SubroutineKind subroutineKind) :
        Symbol(SymbolKind::Subroutine, name, loc), Scope(compilation, this),
        declaredReturnType(*this), defaultLifetime(defaultLifetime),
        subroutineKind(subroutineKind) {}